

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Minefield_State_PDU::SetMineTypes
          (Minefield_State_PDU *this,
          vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_> *MT)

{
  KUINT16 *pKVar1;
  uint uVar2;
  
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 - (short)(*(int *)&this->m_ui16NumMineTypes << 3);
  std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::operator=
            (&this->m_vMineTypes,MT);
  uVar2 = (uint)(*(int *)&(this->m_vMineTypes).
                          super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(this->m_vMineTypes).
                         super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4;
  this->m_ui16NumMineTypes = (KUINT16)uVar2;
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)(uVar2 << 3);
  return;
}

Assistant:

void Minefield_State_PDU::SetMineTypes( const vector<EntityType> & MT )
{
    // Subtract old values from pdu length.
    m_ui16PDULength -= m_ui16NumMineTypes * EntityType::ENTITY_TYPE_SIZE;

    m_vMineTypes = MT;
    m_ui16NumMineTypes = m_vMineTypes.size();

    // Calculate the new size
    m_ui16PDULength += m_ui16NumMineTypes * EntityType::ENTITY_TYPE_SIZE;
}